

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem-C-API.cpp
# Opt level: O0

llb_buildsystem_command_result_t
anon_unknown.dwarf_5b8e::depinfo_tester_command_execute_command
          (void *context,llb_buildsystem_command_t *command,llb_buildsystem_interface_t *bi,
          llb_task_interface_t ti,llb_buildsystem_queue_job_context_t *job)

{
  char *ptr_00;
  char *pcVar1;
  ulong uVar2;
  string local_218;
  string local_1f8;
  allocator local_1d1;
  string local_1d0 [32];
  string local_1b0 [8];
  string depInfoContents;
  string local_170;
  string local_150;
  undefined1 local_130 [8];
  string indirectContents;
  string local_108;
  undefined1 local_e8 [8];
  string indirectInputPath;
  string local_c0 [8];
  string depInfoPath;
  string local_98 [8];
  string outputPath;
  string local_70 [8];
  string directInputPath;
  char *ptr;
  char *desc;
  llb_buildsystem_queue_job_context_t *job_local;
  llb_buildsystem_interface_t *bi_local;
  llb_buildsystem_command_t *command_local;
  void *context_local;
  llb_task_interface_t ti_local;
  
  ptr_00 = llb_buildsystem_command_get_description(command);
  directInputPath.field_2._8_8_ = ptr_00;
  llbuild::basic::sys::strsep((char **)((long)&directInputPath.field_2 + 8),"|");
  pcVar1 = llbuild::basic::sys::strsep((char **)((long)&directInputPath.field_2 + 8),"|");
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,pcVar1,(allocator *)(outputPath.field_2._M_local_buf + 0xf))
  ;
  std::allocator<char>::~allocator((allocator<char> *)(outputPath.field_2._M_local_buf + 0xf));
  pcVar1 = (char *)std::__cxx11::string::c_str();
  puts(pcVar1);
  pcVar1 = llbuild::basic::sys::strsep((char **)((long)&directInputPath.field_2 + 8),"|");
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_98,pcVar1,(allocator *)(depInfoPath.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(depInfoPath.field_2._M_local_buf + 0xf));
  pcVar1 = (char *)std::__cxx11::string::c_str();
  puts(pcVar1);
  pcVar1 = llbuild::basic::sys::strsep((char **)((long)&directInputPath.field_2 + 8),"|");
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_c0,pcVar1,(allocator *)(indirectInputPath.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator
            ((allocator<char> *)(indirectInputPath.field_2._M_local_buf + 0xf));
  pcVar1 = (char *)std::__cxx11::string::c_str();
  puts(pcVar1);
  std::__cxx11::string::string((string *)&local_108,local_70);
  readFileContents((string *)local_e8,&local_108);
  std::__cxx11::string::~string((string *)&local_108);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    std::__cxx11::string::string((string *)&local_150,(string *)local_e8);
    readFileContents((string *)local_130,&local_150);
    std::__cxx11::string::~string((string *)&local_150);
    uVar2 = std::__cxx11::string::empty();
    ti_local.ctx._4_1_ = (uVar2 & 1) != 0;
    if (ti_local.ctx._4_1_) {
      indirectContents.field_2._12_4_ = 1;
    }
    else {
      std::__cxx11::string::string((string *)&local_170,local_98);
      std::__cxx11::string::string
                ((string *)(depInfoContents.field_2._M_local_buf + 8),(string *)local_130);
      writeFileContents(&local_170,(string *)((long)&depInfoContents.field_2 + 8));
      std::__cxx11::string::~string((string *)(depInfoContents.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)&local_170);
      std::__cxx11::string::string(local_1b0);
      std::__cxx11::string::append((char *)local_1b0,0x3504b3);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1d0,"version",&local_1d1);
      std::__cxx11::string::append(local_1b0);
      std::__cxx11::string::~string(local_1d0);
      std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
      std::__cxx11::string::append((char *)local_1b0,0x3504b3);
      std::__cxx11::string::append((char *)local_1b0);
      std::__cxx11::string::append(local_1b0);
      std::__cxx11::string::append((char *)local_1b0,0x3504b3);
      std::__cxx11::string::append((char *)local_1b0);
      std::__cxx11::string::append(local_1b0);
      std::__cxx11::string::append((char *)local_1b0,0x3504b3);
      std::__cxx11::string::string((string *)&local_1f8,local_c0);
      std::__cxx11::string::string((string *)&local_218,local_1b0);
      writeFileContents(&local_1f8,&local_218);
      std::__cxx11::string::~string((string *)&local_218);
      std::__cxx11::string::~string((string *)&local_1f8);
      llb_free(ptr_00);
      indirectContents.field_2._12_4_ = 1;
      std::__cxx11::string::~string(local_1b0);
    }
    ti_local.ctx._5_3_ = 0;
    std::__cxx11::string::~string((string *)local_130);
  }
  else {
    ti_local.ctx._4_4_ = llb_buildsystem_command_result_failed;
    indirectContents.field_2._12_4_ = 1;
  }
  std::__cxx11::string::~string((string *)local_e8);
  std::__cxx11::string::~string(local_c0);
  std::__cxx11::string::~string(local_98);
  std::__cxx11::string::~string(local_70);
  return ti_local.ctx._4_4_;
}

Assistant:

static llb_buildsystem_command_result_t
depinfo_tester_command_execute_command(void *context,
                                       llb_buildsystem_command_t* command,
                                       llb_buildsystem_interface_t* bi,
                                       llb_task_interface_t ti,
                                       llb_buildsystem_queue_job_context_t* job) {
  // The tester tool is given a direct input file whose only contents are the
  // path of another, indirect input file.  It is also given the paths to which
  // it should emit the output file and an ld-style dependency-info file.  It
  // copies the indirect input file to the output file, and creates the depinfo
  // file, recording the direct and indirect input files as input dependencies.
  
  // Because the llb_buildsystem_* API doesn't seem to currently give us access
  // to the command inputs and outputs, and because extending it to do so would
  // be beyond the scope of the change being tested here, we encode the paths of
  // the input, output, and dep-info files in the command the description, which
  // we can access using llb_buildsystem_* calls.
  
  // So we get the description, which is all we have access to, and rely on the
  // use of the pipe character as a record separator in the unit test manifest.
  // llb_buildsystem_command_get_description() function is documented to return
  // a mutable copy that we then have to free, so we're free to modify it.
  char * desc = llb_buildsystem_command_get_description(command);
  char * ptr = desc;
  llbuild::basic::sys::strsep(&ptr, "|"); // skip over rule name
  std::string directInputPath = llbuild::basic::sys::strsep(&ptr, "|");
  puts(directInputPath.c_str());
  std::string outputPath = llbuild::basic::sys::strsep(&ptr, "|");
  puts(outputPath.c_str());
  std::string depInfoPath = llbuild::basic::sys::strsep(&ptr, "|");
  puts(depInfoPath.c_str());
  
  // Read the absolute path of the indirect input from the direct input.
  std::string indirectInputPath = readFileContents(directInputPath);
  if (indirectInputPath.empty()) {
    return llb_buildsystem_command_result_failed;
  }
  
  // Read the contents of the indirect input.
  std::string indirectContents = readFileContents(indirectInputPath);
  if (indirectContents.empty()) {
    return llb_buildsystem_command_result_failed;
  }
  
  // Write the contents of the indirect input to the output.
  writeFileContents(outputPath, indirectContents);
  
  // Write out the ld-style dependency info file, which consists of a sequence
  // of records.  Each record consists of a type byte followed by a C string
  // (i.e. null-terminated).  Type zero is an information string about the tool
  // that produced the dep-info file (commonly containing its name and version)
  // and type 0x10 is plain input file.
  std::string depInfoContents;
  depInfoContents.append("\0", 1);
  depInfoContents.append(std::string("version"));
  depInfoContents.append("\0", 1);
  depInfoContents.append("\020");
  depInfoContents.append(directInputPath);
  depInfoContents.append("\0", 1);
  depInfoContents.append("\020");
  depInfoContents.append(indirectInputPath);
  depInfoContents.append("\0", 1);
  writeFileContents(depInfoPath, depInfoContents);

  // Clean up.
  llb_free(desc);
  return llb_buildsystem_command_result_succeeded;
}